

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosMath.cpp
# Opt level: O0

Box<Dims> *
adios2::helper::IntersectionStartCount(Dims *start1,Dims *count1,Dims *start2,Dims *count2)

{
  size_type sVar1;
  const_reference pvVar2;
  long lVar3;
  ulong uVar4;
  value_type *__x;
  value_type *pvVar5;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RCX;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDX;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RSI;
  Box<Dims> *in_RDI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_R8;
  size_t intersectionEnd;
  size_t end2_1;
  size_t end1_1;
  size_t intersectionStart;
  size_t d_1;
  size_t end2;
  size_t end1;
  size_t d;
  size_t dimensionsSize;
  Box<Dims> *intersectionStartCount;
  pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  *in_stack_ffffffffffffff30;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this;
  value_type *__x_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  value_type in_stack_ffffffffffffff58;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff60;
  ulong local_60;
  ulong local_40;
  
  std::
  pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  ::
  pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true>
            (in_stack_ffffffffffffff30);
  sVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(in_RSI);
  local_40 = 0;
  while( true ) {
    if (sVar1 <= local_40) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      for (local_60 = 0; local_60 < sVar1; local_60 = local_60 + 1) {
        pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (in_RSI,local_60);
        uVar4 = *pvVar2;
        pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (in_RCX,local_60);
        if (uVar4 < *pvVar2) {
          pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (in_RCX,local_60);
          this_00 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)*pvVar2;
        }
        else {
          pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (in_RSI,local_60);
          this_00 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)*pvVar2;
        }
        pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (in_RSI,local_60);
        this = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)*pvVar2;
        pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (in_RDX,local_60);
        __x = (value_type *)((long)this + (*pvVar2 - 1));
        pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (in_RCX,local_60);
        __x_00 = (value_type *)*pvVar2;
        pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (in_R8,local_60);
        pvVar5 = (value_type *)((long)__x_00 + (*pvVar2 - 1));
        if (pvVar5 < __x) {
          __x = pvVar5;
        }
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(this_00,__x_00);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(this,__x);
      }
      return in_RDI;
    }
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in_RSI,local_40)
    ;
    in_stack_ffffffffffffff58 = *pvVar2;
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in_RDX,local_40)
    ;
    lVar3 = in_stack_ffffffffffffff58 + *pvVar2;
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in_RCX,local_40)
    ;
    in_stack_ffffffffffffff60 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)*pvVar2;
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in_R8,local_40);
    uVar4 = (long)in_stack_ffffffffffffff60 + (*pvVar2 - 1);
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in_RCX,local_40)
    ;
    if (lVar3 - 1U < *pvVar2) break;
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in_RSI,local_40)
    ;
    if (uVar4 < *pvVar2) {
      return in_RDI;
    }
    local_40 = local_40 + 1;
  }
  return in_RDI;
}

Assistant:

Box<Dims> IntersectionStartCount(const Dims &start1, const Dims &count1, const Dims &start2,
                                 const Dims &count2) noexcept
{
    Box<Dims> intersectionStartCount;
    const size_t dimensionsSize = start1.size();

    for (size_t d = 0; d < dimensionsSize; ++d)
    {
        // Don't intercept
        const size_t end1 = start1[d] + count1[d] - 1;
        const size_t end2 = start2[d] + count2[d] - 1;

        if (start2[d] > end1 || end2 < start1[d])
        {
            return intersectionStartCount;
        }
    }

    intersectionStartCount.first.reserve(dimensionsSize);
    intersectionStartCount.second.reserve(dimensionsSize);

    for (size_t d = 0; d < dimensionsSize; ++d)
    {
        const size_t intersectionStart = (start1[d] < start2[d]) ? start2[d] : start1[d];

        // end, must be inclusive
        const size_t end1 = start1[d] + count1[d] - 1;
        const size_t end2 = start2[d] + count2[d] - 1;
        const size_t intersectionEnd = (end1 > end2) ? end2 : end1;

        intersectionStartCount.first.push_back(intersectionStart);
        intersectionStartCount.second.push_back(intersectionEnd - intersectionStart + 1);
    }

    return intersectionStartCount;
}